

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

void __thiscall
TPZSparseBlockDiagonal<double>::FindBlockIndex
          (TPZSparseBlockDiagonal<double> *this,int64_t glob,int64_t *block,int64_t *blockind)

{
  int64_t iVar1;
  long *plVar2;
  long *in_RCX;
  int64_t *in_RDX;
  long in_RSI;
  long in_RDI;
  int64_t ibl;
  int64_t ieq;
  int64_t numbl;
  int64_t local_38;
  long local_30;
  
  iVar1 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0xa0));
  local_38 = 0;
  do {
    if (iVar1 + -2 <= local_38) {
      *in_RDX = -1;
      *in_RCX = -1;
      return;
    }
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xa0),local_38);
    for (local_30 = *plVar2;
        plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xa0),local_38 + 1),
        local_30 < *plVar2; local_30 = local_30 + 1) {
      plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_30);
      if (*plVar2 == in_RSI) {
        *in_RDX = local_38;
        plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xa0),local_38);
        *in_RCX = local_30 - *plVar2;
        return;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::FindBlockIndex(int64_t glob, int64_t &block, int64_t &blockind) const
{
    int64_t numbl = fBlockIndex.NElements()-2;
    int64_t ieq,ibl;
    for(ibl = 0; ibl<numbl; ibl++)
    {
		for(ieq = fBlockIndex[ibl];ieq<fBlockIndex[ibl+1];ieq++)
		{
			if(fBlock[ieq] == glob)
			{
				block = ibl;
				blockind = ieq-fBlockIndex[ibl];
				return;
			}
		}
    }
    block = -1;
    blockind = -1;
}